

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

DecodeStatus DecodeLDR(MCInst *Inst,uint Val,uint64_t Address,void *Decoder)

{
  _Bool _Var1;
  uint32_t RegNo;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint Val_00;
  DecodeStatus DVar5;
  MCInst *in_RCX;
  uint32_t in_ESI;
  uint Rm;
  uint Rt;
  uint Rn;
  uint Cond;
  DecodeStatus S;
  void *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  DecodeStatus local_4;
  
  local_4 = MCDisassembler_Success;
  RegNo = fieldFromInstruction_4(in_ESI,0x10,4);
  uVar2 = fieldFromInstruction_4(in_ESI,0xc,4);
  uVar3 = fieldFromInstruction_4(in_ESI,0,4);
  uVar4 = fieldFromInstruction_4(in_ESI,0x17,1);
  Val_00 = uVar4 << 4 | uVar3;
  uVar3 = fieldFromInstruction_4(in_ESI,0x1c,4);
  uVar4 = fieldFromInstruction_4(in_ESI,8,4);
  if ((uVar4 != 0) || (RegNo == uVar2)) {
    local_4 = MCDisassembler_SoftFail;
  }
  DVar5 = DecodeGPRnopcRegisterClass
                    ((MCInst *)CONCAT44(local_4,uVar3),RegNo,
                     CONCAT44(Val_00,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffb8);
  _Var1 = Check((DecodeStatus *)&stack0xffffffffffffffd4,DVar5);
  if (_Var1) {
    DVar5 = DecodeGPRnopcRegisterClass
                      ((MCInst *)CONCAT44(local_4,uVar3),RegNo,
                       CONCAT44(Val_00,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffb8);
    _Var1 = Check((DecodeStatus *)&stack0xffffffffffffffd4,DVar5);
    if (_Var1) {
      DVar5 = DecodeAddrMode7Operand
                        ((MCInst *)CONCAT44(local_4,uVar3),RegNo,
                         CONCAT44(Val_00,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffb8);
      _Var1 = Check((DecodeStatus *)&stack0xffffffffffffffd4,DVar5);
      if (_Var1) {
        DVar5 = DecodePostIdxReg(in_RCX,local_4,CONCAT44(RegNo,uVar2),
                                 (void *)CONCAT44(Val_00,in_stack_ffffffffffffffc0));
        _Var1 = Check((DecodeStatus *)&stack0xffffffffffffffd4,DVar5);
        if (_Var1) {
          DVar5 = DecodePredicateOperand
                            ((MCInst *)CONCAT44(RegNo,uVar2),Val_00,
                             (uint64_t)in_stack_ffffffffffffffb8,(void *)0x2980e6);
          _Var1 = Check((DecodeStatus *)&stack0xffffffffffffffd4,DVar5);
          if (!_Var1) {
            local_4 = MCDisassembler_Fail;
          }
        }
        else {
          local_4 = MCDisassembler_Fail;
        }
      }
      else {
        local_4 = MCDisassembler_Fail;
      }
    }
    else {
      local_4 = MCDisassembler_Fail;
    }
  }
  else {
    local_4 = MCDisassembler_Fail;
  }
  return local_4;
}

Assistant:

static DecodeStatus DecodeLDR(MCInst *Inst, unsigned Val,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;
	unsigned Cond;
	unsigned Rn = fieldFromInstruction_4(Val, 16, 4);
	unsigned Rt = fieldFromInstruction_4(Val, 12, 4);
	unsigned Rm = fieldFromInstruction_4(Val, 0, 4);
	Rm |= (fieldFromInstruction_4(Val, 23, 1) << 4);
	Cond = fieldFromInstruction_4(Val, 28, 4);

	if (fieldFromInstruction_4(Val, 8, 4) != 0 || Rn == Rt)
		S = MCDisassembler_SoftFail;

	if (!Check(&S, DecodeGPRnopcRegisterClass(Inst, Rt, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeGPRnopcRegisterClass(Inst, Rn, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeAddrMode7Operand(Inst, Rn, Address, Decoder))) 
		return MCDisassembler_Fail;
	if (!Check(&S, DecodePostIdxReg(Inst, Rm, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodePredicateOperand(Inst, Cond, Address, Decoder)))
		return MCDisassembler_Fail;

	return S;
}